

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pagemap.h
# Opt level: O0

void * __thiscall TCMalloc_PageMap2<35>::Next(TCMalloc_PageMap2<35> *this,Number k)

{
  Leaf *pLVar1;
  Number i2;
  Leaf *leaf;
  Number i1;
  Number k_local;
  TCMalloc_PageMap2<35> *this_local;
  
  k_local = k;
  do {
    if (0x7ffffffff < k_local) {
      return (void *)0x0;
    }
    pLVar1 = this->root_[k_local >> 0x12];
    if (pLVar1 != (Leaf *)0x0) {
      for (i2 = k_local & 0x3ffff; i2 < 0x40000; i2 = i2 + 1) {
        if (pLVar1->values[i2] != (void *)0x0) {
          return pLVar1->values[i2];
        }
      }
    }
    k_local = ((k_local >> 0x12) + 1) * 0x40000;
  } while( true );
}

Assistant:

void* Next(Number k) const {
    while (k < (Number(1) << BITS)) {
      const Number i1 = k >> LEAF_BITS;
      Leaf* leaf = root_[i1];
      if (leaf != nullptr) {
        // Scan forward in leaf
        for (Number i2 = k & (LEAF_LENGTH - 1); i2 < LEAF_LENGTH; i2++) {
          if (leaf->values[i2] != nullptr) {
            return leaf->values[i2];
          }
        }
      }
      // Skip to next top-level entry
      k = (i1 + 1) << LEAF_BITS;
    }
    return nullptr;
  }